

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool packing_is_scalar(BufferPackingStandard packing)

{
  bool local_9;
  BufferPackingStandard packing_local;
  
  local_9 = packing == BufferPackingScalar || packing == BufferPackingScalarEnhancedLayout;
  return local_9;
}

Assistant:

static bool packing_is_scalar(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingScalar:
	case BufferPackingScalarEnhancedLayout:
		return true;

	default:
		return false;
	}
}